

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O0

REF_STATUS
distance_metric_fill(REF_GRID_conflict ref_grid,REF_DICT ref_dict_bcs,int argc,char **argv)

{
  char *__filename;
  uint uVar1;
  int iVar2;
  REF_STATUS RVar3;
  char **ppcVar4;
  double dVar5;
  double local_768;
  double local_760;
  double local_758;
  double local_750;
  double local_740;
  double local_720;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_DBL t1;
  REF_DBL t0;
  REF_INT i1;
  REF_INT i0;
  REF_DBL dist;
  REF_DBL h_2;
  REF_DBL d_1 [12];
  REF_DBL m_2 [6];
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_DBL s_1;
  REF_DBL h_1;
  REF_DBL m_1 [6];
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_DBL s;
  REF_DBL h;
  REF_DBL d [12];
  REF_DBL m [6];
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_INT ref_malloc_init_i_5;
  REF_INT ref_malloc_init_i_4;
  REF_INT ref_malloc_init_i_3;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT ncol;
  char space [2];
  char *token;
  char *filename;
  char line [1024];
  FILE *file;
  REF_STATUS ref_private_macro_code_rxs_2;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_DBL *tab_ar;
  REF_DBL *tab_h;
  REF_DBL *tab_dist;
  uint local_a0;
  REF_INT max_tab;
  REF_INT n_tab;
  REF_RECON_RECONSTRUCTION recon;
  REF_DBL *grad_dist;
  REF_BOOL have_spacing_table;
  REF_BOOL have_stepexp;
  REF_DBL aspect_ratio;
  REF_DBL width;
  REF_DBL s2;
  REF_DBL s1;
  REF_DBL h2;
  REF_DBL h1;
  REF_DBL h0;
  REF_INT pos;
  REF_INT node;
  REF_DBL *distance;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  char **argv_local;
  REF_DICT pRStack_20;
  int argc_local;
  REF_DICT ref_dict_bcs_local;
  REF_GRID_conflict ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  distance = (REF_DBL *)ref_grid->node;
  h1 = 0.0;
  h2 = 0.0;
  s1 = 0.0;
  s2 = 0.0;
  width = 0.0;
  aspect_ratio = 0.0;
  _have_spacing_table = 1.0;
  grad_dist._4_4_ = 0;
  grad_dist._0_4_ = 0;
  max_tab = 0;
  local_a0 = 0;
  tab_h = (REF_DBL *)0x0;
  tab_ar = (REF_DBL *)0x0;
  _ref_private_macro_code_rxs_1 = (void *)0x0;
  ref_mpi = (REF_MPI)argv;
  argv_local._4_4_ = argc;
  pRStack_20 = ref_dict_bcs;
  ref_dict_bcs_local = (REF_DICT)ref_grid;
  uVar1 = ref_args_find(argc,argv,"--aspect-ratio",(REF_INT *)&h0);
  if ((uVar1 == 0) || (uVar1 == 5)) {
    if ((h0._0_4_ != -1) && (h0._0_4_ < argv_local._4_4_ + -1)) {
      local_720 = atof(*(char **)(&ref_mpi->n + (long)(h0._0_4_ + 1) * 2));
      if (local_720 < 1.0) {
        local_720 = 1.0;
      }
      _have_spacing_table = local_720;
      if (ref_node->max == 0) {
        printf("limit --aspect-ratio to %f for --stepexp\n",local_720);
      }
    }
    uVar1 = ref_args_find(argv_local._4_4_,(char **)ref_mpi,"--stepexp",(REF_INT *)&h0);
    if ((uVar1 == 0) || (uVar1 == 5)) {
      if (h0._0_4_ != -1) {
        grad_dist._4_4_ = 1;
        if (argv_local._4_4_ <= h0._0_4_ + 6) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1b8,"distance_metric_fill","not enough --stepexp args");
          return 1;
        }
        h1 = atof(*(char **)(&ref_mpi->n + (long)(h0._0_4_ + 1) * 2));
        h2 = atof(*(char **)(&ref_mpi->n + (long)(h0._0_4_ + 2) * 2));
        s1 = atof(*(char **)(&ref_mpi->n + (long)(h0._0_4_ + 3) * 2));
        s2 = atof(*(char **)(&ref_mpi->n + (long)(h0._0_4_ + 4) * 2));
        width = atof(*(char **)(&ref_mpi->n + (long)(h0._0_4_ + 5) * 2));
        aspect_ratio = atof(*(char **)(&ref_mpi->n + (long)(h0._0_4_ + 6) * 2));
        if (ref_node->max == 0) {
          printf("h0 %f h1 %f h2 %f s1 %f s2 %f width %f\n",h1,h2,s1,s2,width,aspect_ratio);
        }
        if (h1 <= 0.0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1c2,"distance_metric_fill","positive h0");
          return 1;
        }
        if (h2 <= 0.0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1c3,"distance_metric_fill","positive h1");
          return 1;
        }
        if (s1 <= 0.0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1c4,"distance_metric_fill","positive h2");
          return 1;
        }
        if (s2 <= 0.0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1c5,"distance_metric_fill","positive s1");
          return 1;
        }
        if (width <= 0.0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1c6,"distance_metric_fill","positive s2");
          return 1;
        }
        if (aspect_ratio <= 0.0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1c7,"distance_metric_fill","positive width");
          return 1;
        }
      }
      uVar1 = ref_args_find(argv_local._4_4_,(char **)ref_mpi,"--spacing-table",(REF_INT *)&h0);
      if ((uVar1 == 0) || (uVar1 == 5)) {
        if ((h0._0_4_ != -1) && (h0._0_4_ < argv_local._4_4_ + -1)) {
          line[0x3f8] = '\0';
          line[0x3f9] = '\0';
          line[0x3fa] = '\0';
          line[0x3fb] = '\0';
          line[0x3fc] = '\0';
          line[0x3fd] = '\0';
          line[0x3fe] = '\0';
          line[0x3ff] = '\0';
          __filename = *(char **)(&ref_mpi->n + (long)(h0._0_4_ + 1) * 2);
          ref_malloc_init_i._2_1_ = ' ';
          ref_malloc_init_i._3_1_ = '\0';
          if (ref_node->max == 0) {
            line._1016_8_ = fopen(__filename,"r");
            if ((FILE *)line._1016_8_ == (FILE *)0x0) {
              printf("unable to open %s\n",__filename);
            }
            if (line._1016_8_ == 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x1d6,"distance_metric_fill","unable to open file");
              return 2;
            }
            local_a0 = 0;
            while (ppcVar4 = (char **)fgets((char *)&filename,0x400,(FILE *)line._1016_8_),
                  &filename == ppcVar4) {
              ref_malloc_init_i_1 = 0;
              _ncol = strtok((char *)&filename,(char *)((long)&ref_malloc_init_i + 2));
              while (_ncol != (char *)0x0) {
                ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1;
                _ncol = strtok((char *)0x0,(char *)((long)&ref_malloc_init_i + 2));
              }
              if (1 < ref_malloc_init_i_1) {
                local_a0 = local_a0 + 1;
              }
            }
            printf(" %d breakpoints in %s\n",(ulong)local_a0,__filename);
            if ((int)local_a0 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x1e2,"distance_metric_fill","malloc tab_dist of REF_DBL negative");
              return 1;
            }
            tab_h = (REF_DBL *)malloc((long)(int)local_a0 << 3);
            if (tab_h == (REF_DBL *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x1e2,"distance_metric_fill","malloc tab_dist of REF_DBL NULL");
              return 2;
            }
            for (ref_malloc_init_i_2 = 0; ref_malloc_init_i_2 < (int)local_a0;
                ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
              tab_h[ref_malloc_init_i_2] = 0.0;
            }
            if ((int)local_a0 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x1e3,"distance_metric_fill","malloc tab_h of REF_DBL negative");
              return 1;
            }
            tab_ar = (REF_DBL *)malloc((long)(int)local_a0 << 3);
            if (tab_ar == (REF_DBL *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x1e3,"distance_metric_fill","malloc tab_h of REF_DBL NULL");
              return 2;
            }
            for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < (int)local_a0;
                ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
              tab_ar[ref_private_macro_code_rss] = 0.0;
            }
            if ((int)local_a0 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x1e4,"distance_metric_fill","malloc tab_ar of REF_DBL negative");
              return 1;
            }
            _ref_private_macro_code_rxs_1 = malloc((long)(int)local_a0 << 3);
            if (_ref_private_macro_code_rxs_1 == (void *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x1e4,"distance_metric_fill","malloc tab_ar of REF_DBL NULL");
              return 2;
            }
            for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < (int)local_a0;
                ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
              *(undefined8 *)
               ((long)_ref_private_macro_code_rxs_1 + (long)ref_private_macro_code_rss_1 * 8) =
                   0x3ff0000000000000;
            }
            iVar2 = fseek((FILE *)line._1016_8_,0,0);
            uVar1 = local_a0;
            if (iVar2 != 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x1e5,"distance_metric_fill","rewind");
              return 1;
            }
            local_a0 = 0;
            while (ppcVar4 = (char **)fgets((char *)&filename,0x400,(FILE *)line._1016_8_),
                  &filename == ppcVar4 && (int)local_a0 < (int)uVar1) {
              ref_malloc_init_i_1 = 0;
              _ncol = strtok((char *)&filename,(char *)((long)&ref_malloc_init_i + 2));
              while (_ncol != (char *)0x0) {
                if (ref_malloc_init_i_1 == 0) {
                  dVar5 = atof(_ncol);
                  tab_h[(int)local_a0] = dVar5;
                }
                if (ref_malloc_init_i_1 == 1) {
                  dVar5 = atof(_ncol);
                  tab_ar[(int)local_a0] = dVar5;
                }
                if (ref_malloc_init_i_1 == 2) {
                  dVar5 = atof(_ncol);
                  *(double *)((long)_ref_private_macro_code_rxs_1 + (long)(int)local_a0 * 8) = dVar5
                  ;
                }
                ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1;
                _ncol = strtok((char *)0x0,(char *)((long)&ref_malloc_init_i + 2));
              }
              if (1 < ref_malloc_init_i_1) {
                printf(" %f %f %f %d\n",tab_h[(int)local_a0],tab_ar[(int)local_a0],
                       *(undefined8 *)
                        ((long)_ref_private_macro_code_rxs_1 + (long)(int)local_a0 * 8),
                       (ulong)local_a0);
                local_a0 = local_a0 + 1;
              }
            }
            fclose((FILE *)line._1016_8_);
            uVar1 = ref_mpi_bcast((REF_MPI)ref_node,&local_a0,1,1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x1f9,"distance_metric_fill",(ulong)uVar1,"n_tab");
              return uVar1;
            }
            if ((int)local_a0 < 3) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x1fa,"distance_metric_fill","table requires 2 entries");
              return 1;
            }
            uVar1 = ref_mpi_bcast((REF_MPI)ref_node,tab_h,local_a0,3);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x1fc,"distance_metric_fill",(ulong)uVar1,"n_tab");
              return uVar1;
            }
            uVar1 = ref_mpi_bcast((REF_MPI)ref_node,tab_ar,local_a0,3);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x1fd,"distance_metric_fill",(ulong)uVar1,"n_tab");
              return uVar1;
            }
            uVar1 = ref_mpi_bcast((REF_MPI)ref_node,_ref_private_macro_code_rxs_1,local_a0,3);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x1fe,"distance_metric_fill",(ulong)uVar1,"n_tab");
              return uVar1;
            }
          }
          else {
            uVar1 = ref_mpi_bcast((REF_MPI)ref_node,&local_a0,1,1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x200,"distance_metric_fill",(ulong)uVar1,"n_tab");
              return uVar1;
            }
            if ((int)local_a0 < 3) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x201,"distance_metric_fill","table requires 2 entries");
              return 1;
            }
            if ((int)local_a0 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x202,"distance_metric_fill","malloc tab_dist of REF_DBL negative");
              return 1;
            }
            tab_h = (REF_DBL *)malloc((long)(int)local_a0 << 3);
            if (tab_h == (REF_DBL *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x202,"distance_metric_fill","malloc tab_dist of REF_DBL NULL");
              return 2;
            }
            for (ref_malloc_init_i_5 = 0; ref_malloc_init_i_5 < (int)local_a0;
                ref_malloc_init_i_5 = ref_malloc_init_i_5 + 1) {
              tab_h[ref_malloc_init_i_5] = 0.0;
            }
            if ((int)local_a0 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x203,"distance_metric_fill","malloc tab_h of REF_DBL negative");
              return 1;
            }
            tab_ar = (REF_DBL *)malloc((long)(int)local_a0 << 3);
            if (tab_ar == (REF_DBL *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x203,"distance_metric_fill","malloc tab_h of REF_DBL NULL");
              return 2;
            }
            for (ref_private_macro_code_rss_5 = 0; ref_private_macro_code_rss_5 < (int)local_a0;
                ref_private_macro_code_rss_5 = ref_private_macro_code_rss_5 + 1) {
              tab_ar[ref_private_macro_code_rss_5] = 0.0;
            }
            if ((int)local_a0 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x204,"distance_metric_fill","malloc tab_ar of REF_DBL negative");
              return 1;
            }
            _ref_private_macro_code_rxs_1 = malloc((long)(int)local_a0 << 3);
            if (_ref_private_macro_code_rxs_1 == (void *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x204,"distance_metric_fill","malloc tab_ar of REF_DBL NULL");
              return 2;
            }
            for (ref_private_macro_code_rss_6 = 0; ref_private_macro_code_rss_6 < (int)local_a0;
                ref_private_macro_code_rss_6 = ref_private_macro_code_rss_6 + 1) {
              *(undefined8 *)
               ((long)_ref_private_macro_code_rxs_1 + (long)ref_private_macro_code_rss_6 * 8) =
                   0x3ff0000000000000;
            }
            uVar1 = ref_mpi_bcast((REF_MPI)ref_node,tab_h,local_a0,3);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x206,"distance_metric_fill",(ulong)uVar1,"n_tab");
              return uVar1;
            }
            uVar1 = ref_mpi_bcast((REF_MPI)ref_node,tab_ar,local_a0,3);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x207,"distance_metric_fill",(ulong)uVar1,"n_tab");
              return uVar1;
            }
            uVar1 = ref_mpi_bcast((REF_MPI)ref_node,_ref_private_macro_code_rxs_1,local_a0,3);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x208,"distance_metric_fill",(ulong)uVar1,"n_tab");
              return uVar1;
            }
          }
          grad_dist._0_4_ = 1;
        }
        if (grad_dist._4_4_ == (int)grad_dist) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x20e,"distance_metric_fill",
                 "set one and only one of --stepexp and --spacing-table");
          ref_grid_local._4_4_ = 1;
        }
        else if (*(int *)((long)distance + 4) < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x210,"distance_metric_fill","malloc distance of REF_DBL negative");
          ref_grid_local._4_4_ = 1;
        }
        else {
          _pos = (REF_DBL *)malloc((long)*(int *)((long)distance + 4) << 3);
          if (_pos == (REF_DBL *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x210,"distance_metric_fill","malloc distance of REF_DBL NULL");
            ref_grid_local._4_4_ = 2;
          }
          else {
            uVar1 = ref_phys_wall_distance((REF_GRID)ref_dict_bcs_local,pRStack_20,_pos);
            if (uVar1 == 0) {
              ref_mpi_stopwatch_stop((REF_MPI)ref_node,"wall distance");
              if (*(int *)(*(long *)&ref_dict_bcs_local->naux + 4) * 3 < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                       ,0x214,"distance_metric_fill","malloc grad_dist of REF_DBL negative");
                ref_grid_local._4_4_ = 1;
              }
              else {
                _n_tab = (REF_DBL *)
                         malloc((long)(*(int *)(*(long *)&ref_dict_bcs_local->naux + 4) * 3) << 3);
                if (_n_tab == (REF_DBL *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                         ,0x214,"distance_metric_fill","malloc grad_dist of REF_DBL NULL");
                  ref_grid_local._4_4_ = 2;
                }
                else {
                  uVar1 = ref_recon_gradient((REF_GRID)ref_dict_bcs_local,_pos,_n_tab,max_tab);
                  if (uVar1 == 0) {
                    if (grad_dist._4_4_ != 0) {
                      if (_have_spacing_table <= 0.0) {
                        for (h0._4_4_ = 0;
                            h0._4_4_ < *(int *)(*(long *)&ref_dict_bcs_local->naux + 4);
                            h0._4_4_ = h0._4_4_ + 1) {
                          if (((-1 < h0._4_4_) &&
                              (h0._4_4_ < *(int *)(*(long *)&ref_dict_bcs_local->naux + 4))) &&
                             (-1 < *(long *)(*(long *)(*(long *)&ref_dict_bcs_local->naux + 0x10) +
                                            (long)h0._4_4_ * 8))) {
                            uVar1 = ref_metric_step_exp(_pos[h0._4_4_],&s_1,h1,h2,s1,s2,width,
                                                        aspect_ratio);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                     ,0x239,"distance_metric_fill",(ulong)uVar1,"step exp");
                              return uVar1;
                            }
                            h_1 = 1.0 / (s_1 * s_1);
                            m_1[0] = 0.0;
                            m_1[1] = 0.0;
                            m_1[2] = 1.0 / (s_1 * s_1);
                            m_1[3] = 0.0;
                            m_1[4] = 1.0 / (s_1 * s_1);
                            if ((ref_dict_bcs_local[8].naux != 0) &&
                               (uVar1 = ref_matrix_twod_m(&h_1), uVar1 != 0)) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                     ,0x240,"distance_metric_fill",(ulong)uVar1,"enforce 2d");
                              return uVar1;
                            }
                            uVar1 = ref_node_metric_set((REF_NODE)distance,h0._4_4_,&h_1);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                     ,0x241,"distance_metric_fill",(ulong)uVar1,"set");
                              return uVar1;
                            }
                          }
                        }
                      }
                      else {
                        for (h0._4_4_ = 0;
                            h0._4_4_ < *(int *)(*(long *)&ref_dict_bcs_local->naux + 4);
                            h0._4_4_ = h0._4_4_ + 1) {
                          if (((-1 < h0._4_4_) &&
                              (h0._4_4_ < *(int *)(*(long *)&ref_dict_bcs_local->naux + 4))) &&
                             (-1 < *(long *)(*(long *)(*(long *)&ref_dict_bcs_local->naux + 0x10) +
                                            (long)h0._4_4_ * 8))) {
                            uVar1 = ref_metric_step_exp(_pos[h0._4_4_],&s,h1,h2,s1,s2,width,
                                                        aspect_ratio);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                     ,0x21e,"distance_metric_fill",(ulong)uVar1,"step exp");
                              return uVar1;
                            }
                            h = 1.0 / (s * s);
                            d[0] = 1.0 / (_have_spacing_table * s * _have_spacing_table * s);
                            d[1] = 1.0 / (_have_spacing_table * s * _have_spacing_table * s);
                            d[2] = _n_tab[h0._4_4_ * 3];
                            d[3] = _n_tab[h0._4_4_ * 3 + 1];
                            d[4] = _n_tab[h0._4_4_ * 3 + 2];
                            RVar3 = ref_math_normalize(d + 2);
                            if (RVar3 == 0) {
                              uVar1 = ref_math_orthonormal_system(d + 2,d + 5,d + 8);
                              if (uVar1 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                       ,0x227,"distance_metric_fill",(ulong)uVar1,"ortho sys");
                                return uVar1;
                              }
                              uVar1 = ref_matrix_form_m(&h,d + 0xb);
                              if (uVar1 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                       ,0x228,"distance_metric_fill",(ulong)uVar1,"form m from d");
                                return uVar1;
                              }
                            }
                            else {
                              d[0xb] = 1.0 / (s * s);
                            }
                            if ((ref_dict_bcs_local[8].naux != 0) &&
                               (uVar1 = ref_matrix_twod_m(d + 0xb), uVar1 != 0)) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                     ,0x231,"distance_metric_fill",(ulong)uVar1,"enforce 2d");
                              return uVar1;
                            }
                            uVar1 = ref_node_metric_set((REF_NODE)distance,h0._4_4_,d + 0xb);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                     ,0x232,"distance_metric_fill",(ulong)uVar1,"set");
                              return uVar1;
                            }
                          }
                        }
                      }
                    }
                    if ((int)grad_dist != 0) {
                      for (h0._4_4_ = 0; h0._4_4_ < *(int *)(*(long *)&ref_dict_bcs_local->naux + 4)
                          ; h0._4_4_ = h0._4_4_ + 1) {
                        if (((-1 < h0._4_4_) &&
                            (h0._4_4_ < *(int *)(*(long *)&ref_dict_bcs_local->naux + 4))) &&
                           (-1 < *(long *)(*(long *)(*(long *)&ref_dict_bcs_local->naux + 0x10) +
                                          (long)h0._4_4_ * 8))) {
                          _i1 = _pos[h0._4_4_];
                          uVar1 = ref_sort_search_dbl(local_a0,tab_h,_i1,(REF_INT *)((long)&t0 + 4))
                          ;
                          if (uVar1 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                   ,0x24f,"distance_metric_fill",(ulong)uVar1,"first index on range"
                                  );
                            return uVar1;
                          }
                          t0._0_4_ = t0._4_4_ + 1;
                          _ref_private_macro_code_rss_19 = 0.0;
                          if ((tab_h[(int)t0._0_4_] - tab_h[(int)t0._4_4_]) * 1e+20 <= 0.0) {
                            local_740 = -((tab_h[(int)t0._0_4_] - tab_h[(int)t0._4_4_]) * 1e+20);
                          }
                          else {
                            local_740 = (tab_h[(int)t0._0_4_] - tab_h[(int)t0._4_4_]) * 1e+20;
                          }
                          if (_i1 - tab_h[(int)t0._4_4_] <= 0.0) {
                            local_750 = -(_i1 - tab_h[(int)t0._4_4_]);
                          }
                          else {
                            local_750 = _i1 - tab_h[(int)t0._4_4_];
                          }
                          if (local_750 < local_740) {
                            _ref_private_macro_code_rss_19 =
                                 (_i1 - tab_h[(int)t0._4_4_]) /
                                 (tab_h[(int)t0._0_4_] - tab_h[(int)t0._4_4_]);
                          }
                          if (0.0 <= _ref_private_macro_code_rss_19) {
                            local_758 = _ref_private_macro_code_rss_19;
                          }
                          else {
                            local_758 = 0.0;
                          }
                          if (1.0 <= local_758) {
                            local_768 = 1.0;
                          }
                          else {
                            if (0.0 <= _ref_private_macro_code_rss_19) {
                              local_760 = _ref_private_macro_code_rss_19;
                            }
                            else {
                              local_760 = 0.0;
                            }
                            local_768 = local_760;
                          }
                          dVar5 = 1.0 - local_768;
                          dist = dVar5 * tab_ar[(int)t0._4_4_] + local_768 * tab_ar[(int)t0._0_4_];
                          _have_spacing_table =
                               dVar5 * *(double *)
                                        ((long)_ref_private_macro_code_rxs_1 +
                                        (long)(int)t0._4_4_ * 8) +
                               local_768 *
                               *(double *)
                                ((long)_ref_private_macro_code_rxs_1 + (long)(int)t0._0_4_ * 8);
                          h_2 = 1.0 / (dist * dist);
                          d_1[0] = 1.0 / (_have_spacing_table * dist * _have_spacing_table * dist);
                          d_1[1] = 1.0 / (_have_spacing_table * dist * _have_spacing_table * dist);
                          d_1[2] = _n_tab[h0._4_4_ * 3];
                          d_1[3] = _n_tab[h0._4_4_ * 3 + 1];
                          d_1[4] = _n_tab[h0._4_4_ * 3 + 2];
                          RVar3 = ref_math_normalize(d_1 + 2);
                          if (RVar3 == 0) {
                            uVar1 = ref_math_orthonormal_system(d_1 + 2,d_1 + 5,d_1 + 8);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                     ,0x262,"distance_metric_fill",(ulong)uVar1,"ortho sys");
                              return uVar1;
                            }
                            uVar1 = ref_matrix_form_m(&h_2,d_1 + 0xb);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                     ,0x263,"distance_metric_fill",(ulong)uVar1,"form m from d");
                              return uVar1;
                            }
                          }
                          else {
                            d_1[0xb] = 1.0 / (dist * dist);
                          }
                          if ((ref_dict_bcs_local[8].naux != 0) &&
                             (uVar1 = ref_matrix_twod_m(d_1 + 0xb), uVar1 != 0)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                   ,0x26c,"distance_metric_fill",(ulong)uVar1,"enforce 2d");
                            return uVar1;
                          }
                          uVar1 = ref_node_metric_set((REF_NODE)distance,h0._4_4_,d_1 + 0xb);
                          if (uVar1 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                   ,0x272,"distance_metric_fill",(ulong)uVar1,"set");
                            printf("dist %f h %f ar %f t0 %f t1 %f i0 %d i1 %d\n",_i1,dist,
                                   _have_spacing_table,dVar5,local_768,(ulong)t0._4_4_,
                                   (ulong)t0._0_4_);
                            printf("tab_h[i0] %f tab_h[i1] %f tab_h[i0] %f tab_h[i1] %f\n",
                                   tab_h[(int)t0._4_4_],tab_h[(int)t0._0_4_],tab_ar[(int)t0._4_4_],
                                   tab_ar[(int)t0._0_4_]);
                            return uVar1;
                          }
                        }
                      }
                      if (_ref_private_macro_code_rxs_1 != (void *)0x0) {
                        free(_ref_private_macro_code_rxs_1);
                      }
                      if (tab_ar != (REF_DBL *)0x0) {
                        free(tab_ar);
                      }
                      if (tab_h != (REF_DBL *)0x0) {
                        free(tab_h);
                      }
                    }
                    if (_n_tab != (REF_DBL *)0x0) {
                      free(_n_tab);
                    }
                    if (_pos != (REF_DBL *)0x0) {
                      free(_pos);
                    }
                    ref_grid_local._4_4_ = 0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0x215,"distance_metric_fill",(ulong)uVar1,"grad dist");
                    ref_grid_local._4_4_ = uVar1;
                  }
                }
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x211,"distance_metric_fill",(ulong)uVar1,"wall dist");
              ref_grid_local._4_4_ = uVar1;
            }
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1cb,"distance_metric_fill",(ulong)uVar1,"metric arg search");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x1b5,"distance_metric_fill",(ulong)uVar1,"arg search");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x1ac,"distance_metric_fill",(ulong)uVar1,"arg search");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

static REF_STATUS distance_metric_fill(REF_GRID ref_grid, REF_DICT ref_dict_bcs,
                                       int argc, char *argv[]) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *distance;
  REF_INT node;
  REF_INT pos;
  REF_DBL h0 = 0.0, h1 = 0.0, h2 = 0.0, s1 = 0.0, s2 = 0.0, width = 0.0;
  REF_DBL aspect_ratio = 1.0;
  REF_BOOL have_stepexp = REF_FALSE;
  REF_BOOL have_spacing_table = REF_FALSE;
  REF_DBL *grad_dist;
  REF_RECON_RECONSTRUCTION recon = REF_RECON_L2PROJECTION;
  REF_INT n_tab = 0, max_tab;
  REF_DBL *tab_dist = NULL, *tab_h = NULL, *tab_ar = NULL;

  RXS(ref_args_find(argc, argv, "--aspect-ratio", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    aspect_ratio = atof(argv[pos + 1]);
    aspect_ratio = MAX(1.0, aspect_ratio);
    if (ref_mpi_once(ref_mpi))
      printf("limit --aspect-ratio to %f for --stepexp\n", aspect_ratio);
  }

  RXS(ref_args_find(argc, argv, "--stepexp", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    have_stepexp = REF_TRUE;
    RAS(pos + 6 < argc, "not enough --stepexp args");
    h0 = atof(argv[pos + 1]);
    h1 = atof(argv[pos + 2]);
    h2 = atof(argv[pos + 3]);
    s1 = atof(argv[pos + 4]);
    s2 = atof(argv[pos + 5]);
    width = atof(argv[pos + 6]);
    if (ref_mpi_once(ref_mpi))
      printf("h0 %f h1 %f h2 %f s1 %f s2 %f width %f\n", h0, h1, h2, s1, s2,
             width);
    RAS(h0 > 0.0, "positive h0");
    RAS(h1 > 0.0, "positive h1");
    RAS(h2 > 0.0, "positive h2");
    RAS(s1 > 0.0, "positive s1");
    RAS(s2 > 0.0, "positive s2");
    RAS(width > 0.0, "positive width");
  }

  RXS(ref_args_find(argc, argv, "--spacing-table", &pos), REF_NOT_FOUND,
      "metric arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    FILE *file = NULL;
    char line[1024];
    const char *filename = argv[pos + 1];
    const char *token;
    const char space[] = " ";
    REF_INT ncol;
    if (ref_mpi_once(ref_mpi)) {
      file = fopen(filename, "r");
      if (NULL == (void *)file) printf("unable to open %s\n", filename);
      RNS(file, "unable to open file");
      n_tab = 0;
      while (line == fgets(line, 1024, file)) {
        ncol = 0;
        token = strtok(line, space);
        while (token != NULL) {
          ncol++;
          token = strtok(NULL, space);
        }
        if (ncol >= 2) n_tab++;
      }
      printf(" %d breakpoints in %s\n", n_tab, filename);
      ref_malloc_init(tab_dist, n_tab, REF_DBL, 0.0);
      ref_malloc_init(tab_h, n_tab, REF_DBL, 0.0);
      ref_malloc_init(tab_ar, n_tab, REF_DBL, 1.0);
      RAS(0 == fseek(file, 0, SEEK_SET), "rewind");
      max_tab = n_tab;
      n_tab = 0;
      while (line == fgets(line, 1024, file) && n_tab < max_tab) {
        ncol = 0;
        token = strtok(line, space);
        while (token != NULL) {
          if (0 == ncol) tab_dist[n_tab] = atof(token);
          if (1 == ncol) tab_h[n_tab] = atof(token);
          if (2 == ncol) tab_ar[n_tab] = atof(token);
          ncol++;
          token = strtok(NULL, space);
        }
        if (ncol >= 2) {
          printf(" %f %f %f %d\n", tab_dist[n_tab], tab_h[n_tab], tab_ar[n_tab],
                 n_tab);
          n_tab++;
        }
      }
      fclose(file);
      RSS(ref_mpi_bcast(ref_mpi, (void *)&n_tab, 1, REF_INT_TYPE), "n_tab");
      RAS(n_tab > 2, "table requires 2 entries");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_dist, n_tab, REF_DBL_TYPE),
          "n_tab");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_h, n_tab, REF_DBL_TYPE), "n_tab");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_ar, n_tab, REF_DBL_TYPE), "n_tab");
    } else {
      RSS(ref_mpi_bcast(ref_mpi, (void *)&n_tab, 1, REF_INT_TYPE), "n_tab");
      RAS(n_tab > 2, "table requires 2 entries");
      ref_malloc_init(tab_dist, n_tab, REF_DBL, 0.0);
      ref_malloc_init(tab_h, n_tab, REF_DBL, 0.0);
      ref_malloc_init(tab_ar, n_tab, REF_DBL, 1.0);
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_dist, n_tab, REF_DBL_TYPE),
          "n_tab");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_h, n_tab, REF_DBL_TYPE), "n_tab");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_ar, n_tab, REF_DBL_TYPE), "n_tab");
    }
    have_spacing_table = REF_TRUE;
  }

  RAS(have_stepexp != have_spacing_table,
      "set one and only one of --stepexp and --spacing-table");

  ref_malloc(distance, ref_node_max(ref_node), REF_DBL);
  RSS(ref_phys_wall_distance(ref_grid, ref_dict_bcs, distance), "wall dist");
  ref_mpi_stopwatch_stop(ref_mpi, "wall distance");

  ref_malloc(grad_dist, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  RSS(ref_recon_gradient(ref_grid, distance, grad_dist, recon), "grad dist");

  if (have_stepexp) {
    if (aspect_ratio > 0.0) {
      each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
        REF_DBL m[6];
        REF_DBL d[12];
        REF_DBL h;
        REF_DBL s = distance[node];
        RSS(ref_metric_step_exp(s, &h, h0, h1, h2, s1, s2, width), "step exp");
        ref_matrix_eig(d, 0) = 1.0 / (h * h);
        ref_matrix_eig(d, 1) = 1.0 / (aspect_ratio * h * aspect_ratio * h);
        ref_matrix_eig(d, 2) = 1.0 / (aspect_ratio * h * aspect_ratio * h);
        ref_matrix_vec(d, 0, 0) = grad_dist[0 + 3 * node];
        ref_matrix_vec(d, 1, 0) = grad_dist[1 + 3 * node];
        ref_matrix_vec(d, 2, 0) = grad_dist[2 + 3 * node];
        if (REF_SUCCESS == ref_math_normalize(&(d[3]))) {
          RSS(ref_math_orthonormal_system(&(d[3]), &(d[6]), &(d[9])),
              "ortho sys");
          RSS(ref_matrix_form_m(d, m), "form m from d");
        } else {
          m[0] = 1.0 / (h * h);
          m[1] = 0.0;
          m[2] = 0.0;
          m[3] = 1.0 / (h * h);
          m[4] = 0.0;
          m[5] = 1.0 / (h * h);
        }
        if (ref_grid_twod(ref_grid)) RSS(ref_matrix_twod_m(m), "enforce 2d");
        RSS(ref_node_metric_set(ref_node, node, m), "set");
      }
    } else {
      each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
        REF_DBL m[6];
        REF_DBL h;
        REF_DBL s = distance[node];
        RSS(ref_metric_step_exp(s, &h, h0, h1, h2, s1, s2, width), "step exp");
        m[0] = 1.0 / (h * h);
        m[1] = 0.0;
        m[2] = 0.0;
        m[3] = 1.0 / (h * h);
        m[4] = 0.0;
        m[5] = 1.0 / (h * h);
        if (ref_grid_twod(ref_grid)) RSS(ref_matrix_twod_m(m), "enforce 2d");
        RSS(ref_node_metric_set(ref_node, node, m), "set");
      }
    }
  }

  if (have_spacing_table) {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      REF_DBL m[6];
      REF_DBL d[12];
      REF_DBL h;
      REF_DBL dist = distance[node];
      REF_INT i0, i1;
      REF_DBL t0, t1;
      RSS(ref_sort_search_dbl(n_tab, tab_dist, dist, &i0),
          "first index on range");
      i1 = i0 + 1;
      t1 = 0.0;
      if (ref_math_divisible((dist - tab_dist[i0]),
                             (tab_dist[i1] - tab_dist[i0]))) {
        t1 = (dist - tab_dist[i0]) / (tab_dist[i1] - tab_dist[i0]);
      }
      t1 = MIN(MAX(0.0, t1), 1.0);
      t0 = 1.0 - t1;
      h = t0 * tab_h[i0] + t1 * tab_h[i1];
      aspect_ratio = t0 * tab_ar[i0] + t1 * tab_ar[i1];
      ref_matrix_eig(d, 0) = 1.0 / (h * h);
      ref_matrix_eig(d, 1) = 1.0 / (aspect_ratio * h * aspect_ratio * h);
      ref_matrix_eig(d, 2) = 1.0 / (aspect_ratio * h * aspect_ratio * h);
      ref_matrix_vec(d, 0, 0) = grad_dist[0 + 3 * node];
      ref_matrix_vec(d, 1, 0) = grad_dist[1 + 3 * node];
      ref_matrix_vec(d, 2, 0) = grad_dist[2 + 3 * node];
      if (REF_SUCCESS == ref_math_normalize(&(d[3]))) {
        RSS(ref_math_orthonormal_system(&(d[3]), &(d[6]), &(d[9])),
            "ortho sys");
        RSS(ref_matrix_form_m(d, m), "form m from d");
      } else {
        m[0] = 1.0 / (h * h);
        m[1] = 0.0;
        m[2] = 0.0;
        m[3] = 1.0 / (h * h);
        m[4] = 0.0;
        m[5] = 1.0 / (h * h);
      }
      if (ref_grid_twod(ref_grid)) RSS(ref_matrix_twod_m(m), "enforce 2d");
      RSB(ref_node_metric_set(ref_node, node, m), "set", {
        printf("dist %f h %f ar %f t0 %f t1 %f i0 %d i1 %d\n", dist, h,
               aspect_ratio, t0, t1, i0, i1);
        printf("tab_h[i0] %f tab_h[i1] %f tab_h[i0] %f tab_h[i1] %f\n",
               tab_dist[i0], tab_dist[i1], tab_h[i0], tab_h[i1]);
      });
    }

    ref_free(tab_ar);
    ref_free(tab_h);
    ref_free(tab_dist);
  }

  ref_free(grad_dist);
  ref_free(distance);
  return REF_SUCCESS;
}